

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

ImportStatus try_path(string *dir,string *rel,string *content,string *found_here,string *err_msg)

{
  byte bVar1;
  long lVar2;
  char *pcVar3;
  undefined8 uVar4;
  int *piVar5;
  string *in_RCX;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_RDX;
  string *in_RSI;
  string *in_R8;
  failure *io_err;
  ifstream f;
  string abs_path;
  undefined7 in_stack_fffffffffffffd38;
  istreambuf_iterator<char,_std::char_traits<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  undefined1 local_288 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_fffffffffffffd88;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_fffffffffffffd98;
  string local_80 [32];
  undefined4 local_60;
  istreambuf_iterator<char,_std::char_traits<char>_> local_50 [2];
  string *local_30;
  string *local_28;
  istreambuf_iterator<char,_std::char_traits<char>_> *local_20;
  string *local_18;
  ImportStatus local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::__cxx11::string::string((string *)local_50);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    std::__cxx11::string::operator=(local_30,"the empty string is not a valid filename");
    local_4 = IMPORT_STATUS_IO_ERROR;
    local_60 = 1;
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
    if (*pcVar3 == '/') {
      std::__cxx11::string::operator=((string *)local_50,local_18);
    }
    else {
      std::operator+(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      std::__cxx11::string::operator=((string *)local_50,local_80);
      std::__cxx11::string::~string(local_80);
    }
    this = local_50;
    std::__cxx11::string::length();
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
    if (*pcVar3 == '/') {
      std::__cxx11::string::operator=(local_30,"attempted to import a directory");
      local_4 = IMPORT_STATUS_IO_ERROR;
      local_60 = 1;
    }
    else {
      std::ifstream::ifstream(local_288);
      uVar4 = std::__cxx11::string::c_str();
      std::ifstream::open(local_288,uVar4,8);
      bVar1 = std::ios::good();
      if ((bVar1 & 1) == 0) {
        local_4 = IMPORT_STATUS_FILE_NOT_FOUND;
      }
      else {
        std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                  (this,(istream_type *)CONCAT17(bVar1,in_stack_fffffffffffffd38));
        std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator(local_20);
        std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd98,in_stack_fffffffffffffd88);
        bVar1 = std::ios::good();
        if ((bVar1 & 1) == 0) {
          piVar5 = __errno_location();
          pcVar3 = strerror(*piVar5);
          std::__cxx11::string::operator=(local_30,pcVar3);
          local_4 = IMPORT_STATUS_IO_ERROR;
        }
        else {
          std::__cxx11::string::operator=(local_28,(string *)local_50);
          local_4 = IMPORT_STATUS_OK;
        }
      }
      local_60 = 1;
      std::ifstream::~ifstream(local_288);
    }
  }
  std::__cxx11::string::~string((string *)local_50);
  return local_4;
}

Assistant:

static enum ImportStatus try_path(const std::string &dir, const std::string &rel,
                                  std::string &content, std::string &found_here,
                                  std::string &err_msg)
{
    std::string abs_path;
    if (rel.length() == 0) {
        err_msg = "the empty string is not a valid filename";
        return IMPORT_STATUS_IO_ERROR;
    }
    // It is possible that rel is actually absolute.
    if (rel[0] == '/') {
        abs_path = rel;
    } else {
        abs_path = dir + rel;
    }

    if (abs_path[abs_path.length() - 1] == '/') {
        err_msg = "attempted to import a directory";
        return IMPORT_STATUS_IO_ERROR;
    }

    std::ifstream f;
    f.open(abs_path.c_str());
    if (!f.good())
        return IMPORT_STATUS_FILE_NOT_FOUND;
    try {
        content.assign(std::istreambuf_iterator<char>(f), std::istreambuf_iterator<char>());
    } catch (const std::ios_base::failure &io_err) {
        err_msg = io_err.what();
        return IMPORT_STATUS_IO_ERROR;
    }
    if (!f.good()) {
        err_msg = strerror(errno);
        return IMPORT_STATUS_IO_ERROR;
    }

    found_here = abs_path;

    return IMPORT_STATUS_OK;
}